

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_file.c
# Opt level: O0

ion_boolean_t
flat_file_predicate_within_bounds(ion_flat_file_t *flat_file,ion_flat_file_row_t *row,va_list *args)

{
  uint uVar1;
  ion_key_t pvVar2;
  ion_key_t pvVar3;
  char cVar4;
  bool local_61;
  undefined8 *local_60;
  undefined8 *local_48;
  ion_key_t upper_bound;
  ion_key_t lower_bound;
  va_list *args_local;
  ion_flat_file_row_t *row_local;
  ion_flat_file_t *flat_file_local;
  
  uVar1 = (*args)[0].gp_offset;
  if (uVar1 < 0x29) {
    local_48 = (undefined8 *)((long)(int)uVar1 + (long)(*args)[0].reg_save_area);
    (*args)[0].gp_offset = uVar1 + 8;
  }
  else {
    local_48 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = local_48 + 1;
  }
  pvVar2 = (ion_key_t)*local_48;
  uVar1 = (*args)[0].gp_offset;
  if (uVar1 < 0x29) {
    local_60 = (undefined8 *)((long)(int)uVar1 + (long)(*args)[0].reg_save_area);
    (*args)[0].gp_offset = uVar1 + 8;
  }
  else {
    local_60 = (undefined8 *)(*args)[0].overflow_arg_area;
    (*args)[0].overflow_arg_area = local_60 + 1;
  }
  pvVar3 = (ion_key_t)*local_60;
  local_61 = false;
  if (row->row_status == '\x01') {
    cVar4 = (*(flat_file->super).compare)(row->key,pvVar2,(flat_file->super).record.key_size);
    local_61 = false;
    if (-1 < cVar4) {
      cVar4 = (*(flat_file->super).compare)(row->key,pvVar3,(flat_file->super).record.key_size);
      local_61 = cVar4 < '\x01';
    }
  }
  return local_61;
}

Assistant:

ion_boolean_t
flat_file_predicate_within_bounds(
	ion_flat_file_t		*flat_file,
	ion_flat_file_row_t *row,
	va_list				*args
) {
	ion_key_t	lower_bound = va_arg(*args, ion_key_t);
	ion_key_t	upper_bound = va_arg(*args, ion_key_t);

	return ION_FLAT_FILE_STATUS_OCCUPIED == row->row_status && flat_file->super.compare(row->key, lower_bound, flat_file->super.record.key_size) >= 0 && flat_file->super.compare(row->key, upper_bound, flat_file->super.record.key_size) <= 0;
}